

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O3

bool __thiscall
OSSLRSA::generateKeyPair
          (OSSLRSA *this,AsymmetricKeyPair **ppKeyPair,AsymmetricParameters *parameters,RNG *param_3
          )

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ByteString *pBVar3;
  RSA *rsa;
  BIGNUM *e;
  OSSLRSAKeyPair *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar4;
  char *pcVar5;
  
  if (parameters == (AsymmetricParameters *)0x0 || ppKeyPair == (AsymmetricKeyPair **)0x0) {
    return false;
  }
  iVar1 = (*(parameters->super_Serialisable)._vptr_Serialisable[3])(parameters,RSAParameters::type);
  if ((char)iVar1 == '\0') {
    pcVar5 = "Invalid parameters supplied for RSA key generation";
    iVar1 = 0x54a;
LAB_0015e30f:
    softHSMLog(3,"generateKeyPair",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
               ,iVar1,pcVar5);
    return false;
  }
  sVar2 = RSAParameters::getBitLength((RSAParameters *)parameters);
  iVar1 = (*(this->super_AsymmetricAlgorithm)._vptr_AsymmetricAlgorithm[0xd])(this);
  if (CONCAT44(extraout_var,iVar1) <= sVar2) {
    sVar2 = RSAParameters::getBitLength((RSAParameters *)parameters);
    iVar1 = (*(this->super_AsymmetricAlgorithm)._vptr_AsymmetricAlgorithm[0xe])(this);
    if (sVar2 <= CONCAT44(extraout_var_00,iVar1)) {
      sVar2 = RSAParameters::getBitLength((RSAParameters *)parameters);
      if (sVar2 < 0x400) {
        softHSMLog(4,"generateKeyPair",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0x55a,"Using an RSA key size < 1024 bits is not recommended");
      }
      pBVar3 = RSAParameters::getE((RSAParameters *)parameters);
      sVar2 = ByteString::long_val(pBVar3);
      if ((sVar2 & 1) != 0) {
        rsa = RSA_new();
        if (rsa != (RSA *)0x0) {
          pBVar3 = RSAParameters::getE((RSAParameters *)parameters);
          e = (BIGNUM *)OSSL::byteString2bn(pBVar3);
          sVar2 = RSAParameters::getBitLength((RSAParameters *)parameters);
          iVar1 = RSA_generate_key_ex(rsa,(int)sVar2,e,(BN_GENCB *)0x0);
          if (iVar1 != 0) {
            BN_free(e);
            this_00 = (OSSLRSAKeyPair *)operator_new(0x1b8);
            memset(this_00,0,0x1b8);
            OSSLRSAKeyPair::OSSLRSAKeyPair(this_00);
            iVar1 = (*(this_00->super_AsymmetricKeyPair).super_Serialisable._vptr_Serialisable[3])
                              (this_00);
            (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x58))
                      ((long *)CONCAT44(extraout_var_01,iVar1),rsa);
            iVar1 = (*(this_00->super_AsymmetricKeyPair).super_Serialisable._vptr_Serialisable[5])
                              (this_00);
            (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 200))
                      ((long *)CONCAT44(extraout_var_02,iVar1),rsa);
            *ppKeyPair = (AsymmetricKeyPair *)this_00;
            RSA_free(rsa);
            return true;
          }
          uVar4 = ERR_get_error();
          softHSMLog(3,"generateKeyPair",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                     ,0x576,"RSA key generation failed (0x%08X)",uVar4);
          BN_free(e);
          RSA_free(rsa);
          return false;
        }
        pcVar5 = "Failed to instantiate OpenSSL RSA object";
        iVar1 = 0x56c;
        goto LAB_0015e30f;
      }
      pcVar5 = "Invalid RSA public exponent %d";
      iVar1 = 0x563;
      goto LAB_0015e2e2;
    }
  }
  sVar2 = RSAParameters::getBitLength((RSAParameters *)parameters);
  pcVar5 = "This RSA key size (%lu) is not supported";
  iVar1 = 0x553;
LAB_0015e2e2:
  softHSMLog(3,"generateKeyPair",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
             ,iVar1,pcVar5,sVar2);
  return false;
}

Assistant:

bool OSSLRSA::generateKeyPair(AsymmetricKeyPair** ppKeyPair, AsymmetricParameters* parameters, RNG* /*rng = NULL */)
{
	// Check parameters
	if ((ppKeyPair == NULL) ||
	    (parameters == NULL))
	{
		return false;
	}

	if (!parameters->areOfType(RSAParameters::type))
	{
		ERROR_MSG("Invalid parameters supplied for RSA key generation");

		return false;
	}

	RSAParameters* params = (RSAParameters*) parameters;

	if (params->getBitLength() < getMinKeySize() || params->getBitLength() > getMaxKeySize())
	{
		ERROR_MSG("This RSA key size (%lu) is not supported", params->getBitLength());

		return false;
	}

	if (params->getBitLength() < 1024)
	{
		WARNING_MSG("Using an RSA key size < 1024 bits is not recommended");
	}

	// Retrieve the desired public exponent
	unsigned long e = params->getE().long_val();

	// Check the public exponent
	if ((e == 0) || (e % 2 != 1))
	{
		ERROR_MSG("Invalid RSA public exponent %d", e);

		return false;
	}

	// Generate the key-pair
	RSA* rsa = RSA_new();
	if (rsa == NULL)
	{
		ERROR_MSG("Failed to instantiate OpenSSL RSA object");

		return false;
	}

	BIGNUM* bn_e = OSSL::byteString2bn(params->getE());

	// Check if the key was successfully generated
	if (!RSA_generate_key_ex(rsa, params->getBitLength(), bn_e, NULL))
	{
		ERROR_MSG("RSA key generation failed (0x%08X)", ERR_get_error());
		BN_free(bn_e);
		RSA_free(rsa);

		return false;
	}
	BN_free(bn_e);

	// Create an asymmetric key-pair object to return
	OSSLRSAKeyPair* kp = new OSSLRSAKeyPair();

	((OSSLRSAPublicKey*) kp->getPublicKey())->setFromOSSL(rsa);
	((OSSLRSAPrivateKey*) kp->getPrivateKey())->setFromOSSL(rsa);

	*ppKeyPair = kp;

	// Release the key
	RSA_free(rsa);

	return true;
}